

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O0

Reals __thiscall Omega_h::element_implied_length_metrics_dim<1>(Omega_h *this,Mesh *mesh)

{
  LO LVar1;
  void *extraout_RDX;
  Reals RVar2;
  Write<double> local_d8;
  undefined1 local_c8 [8];
  type f;
  string local_90 [32];
  undefined1 local_70 [8];
  Write<double> out;
  Reals sizes;
  undefined1 local_40 [8];
  Reals coords;
  LOs ev2v;
  Mesh *mesh_local;
  
  Mesh::ask_elem_verts((Mesh *)&coords.write_.shared_alloc_.direct_ptr);
  Mesh::coords((Mesh *)local_40);
  Mesh::ask_sizes((Mesh *)&out.shared_alloc_.direct_ptr);
  LVar1 = Mesh::nelems(mesh);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"",(allocator *)((long)&f.out.shared_alloc_.direct_ptr + 7))
  ;
  Write<double>::Write((Write<double> *)local_70,LVar1,(string *)local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)((long)&f.out.shared_alloc_.direct_ptr + 7));
  Read<int>::Read((Read<int> *)local_c8,(Read<int> *)&coords.write_.shared_alloc_.direct_ptr);
  Read<double>::Read((Read<double> *)&f.ev2v.write_.shared_alloc_.direct_ptr,
                     (Read<double> *)local_40);
  Write<double>::Write
            ((Write<double> *)&f.coords.write_.shared_alloc_.direct_ptr,(Write<double> *)local_70);
  LVar1 = Mesh::nelems(mesh);
  parallel_for<Omega_h::element_implied_length_metrics_dim<1>(Omega_h::Mesh*)::_lambda(int)_1_>
            (LVar1,(type *)local_c8,"element_implied_length_metrics");
  Write<double>::Write(&local_d8,(Write<signed_char> *)local_70);
  Read<double>::Read((Read<double> *)this,&local_d8);
  Write<double>::~Write(&local_d8);
  element_implied_length_metrics_dim<1>(Omega_h::Mesh*)::{lambda(int)#1}::~Mesh
            ((_lambda_int__1_ *)local_c8);
  Write<double>::~Write((Write<double> *)local_70);
  Read<double>::~Read((Read<double> *)&out.shared_alloc_.direct_ptr);
  Read<double>::~Read((Read<double> *)local_40);
  Read<int>::~Read((Read<int> *)&coords.write_.shared_alloc_.direct_ptr);
  RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals element_implied_length_metrics_dim(Mesh* mesh) {
  auto ev2v = mesh->ask_elem_verts();
  auto coords = mesh->coords();
  auto sizes = mesh->ask_sizes();
  auto out = Write<Real>(mesh->nelems() * symm_ncomps(dim));
  auto f = OMEGA_H_LAMBDA(LO e) {
    auto v = gather_verts<dim + 1>(ev2v, e);
    auto p = gather_vectors<dim + 1, dim>(coords, v);
    auto m = element_implied_metric(p);
    set_symm(out, e, m);
  };
  parallel_for(mesh->nelems(), f, "element_implied_length_metrics");
  return out;
}